

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O2

wchar_t effect_subtype(wchar_t index,char *type)

{
  long lVar1;
  _Bool _Var2;
  wchar_t wVar3;
  int iVar4;
  char *in_RAX;
  long lVar5;
  char *__s2;
  char *pe;
  
  pe = in_RAX;
  lVar5 = strtol(type,&pe,10);
  if (pe != type) {
    _Var2 = contains_only_spaces(pe);
    lVar1 = -1;
    if (lVar5 + 0x7fffffffU >> 1 < 0x7fffffff) {
      lVar1 = lVar5;
    }
    if (_Var2) {
      return (wchar_t)lVar1;
    }
    return L'\xffffffff';
  }
  switch(index) {
  case L'\x06':
    iVar4 = strcmp(type,"INC_BY");
    if (iVar4 == 0) {
      return L'\0';
    }
    iVar4 = strcmp(type,"DEC_BY");
    if (iVar4 == 0) {
      return L'\x01';
    }
    iVar4 = strcmp(type,"SET_TO");
    if (iVar4 == 0) {
      return L'\x02';
    }
    iVar4 = strcmp(type,"INC_TO");
    if (iVar4 != 0) {
      return L'\xffffffff';
    }
    return L'\x03';
  case L'\b':
  case L'\t':
  case L'\n':
  case L'\v':
  case L'\r':
    wVar3 = timed_name_to_idx(type);
    return wVar3;
  case L'\f':
    wVar3 = mon_timed_name_to_idx(type);
    return wVar3;
  case L'\x0e':
    iVar4 = strcmp(type,"WARDING");
    if (iVar4 == 0) {
      return L'\x01';
    }
    iVar4 = strcmp(type,"DECOY");
    if (iVar4 != 0) {
      return L'\xffffffff';
    }
    return L'\x02';
  case L'\x10':
  case L'\x11':
  case L'\x12':
  case L'\x13':
    wVar3 = stat_name_to_idx(type);
    return wVar3;
  case L'\x18':
    __s2 = "SPECIAL";
    break;
  case L'1':
    iVar4 = strcmp(type,"TOBOTH");
    if (iVar4 == 0) {
      return L'\x03';
    }
    iVar4 = strcmp(type,"TOHIT");
    if (iVar4 == 0) {
      return L'\x01';
    }
    iVar4 = strcmp(type,"TODAM");
    if (iVar4 == 0) {
      return L'\x02';
    }
    iVar4 = strcmp(type,"TOAC");
    if (iVar4 != 0) {
      return L'\xffffffff';
    }
    return L'\x04';
  case L'3':
  case L'4':
  case L'@':
  case L'I':
  case L'J':
  case L'K':
  case L'L':
  case L'M':
  case L'N':
  case L'O':
  case L'P':
  case L'Q':
  case L'R':
  case L'S':
  case L'T':
  case L'U':
  case L'X':
  case L'Y':
  case L'Z':
  case L'[':
  case L'\\':
  case L']':
  case L'^':
  case L'_':
  case L'`':
  case L'a':
  case L'b':
  case L'q':
    wVar3 = proj_name_to_idx(type);
    return wVar3;
  case L'7':
    wVar3 = summon_name_to_idx(type);
    return wVar3;
  case L';':
    __s2 = "AWAY";
    break;
  case L'<':
    __s2 = "SELF";
    break;
  case L'A':
    iVar4 = strcmp(type,"TARGETED");
    if (iVar4 == 0) {
      return L'\x01';
    }
  default:
    iVar4 = strcmp(type,"NONE");
    if (iVar4 != 0) {
      return L'\xffffffff';
    }
    return L'\0';
  case L'k':
  case L'x':
    wVar3 = shape_name_to_idx(type);
    return wVar3;
  }
  iVar4 = strcmp(type,__s2);
  if (iVar4 != 0) {
    return L'\xffffffff';
  }
  return L'\x01';
}

Assistant:

int effect_subtype(int index, const char *type)
{
	char *pe;
	long lv;

	lv = strtol(type, &pe, 10);
	if (pe != type) {
		/*
		 * Got a plain numeric value.  Verify that there isn't garbage
		 * after it and that it doesn't overflow.  Also reject INT_MIN
		 * and INT_MAX so don't have to check errno to detect overflow
		 * when sizeof(long) == sizeof(int).
		 */
		return (contains_only_spaces(pe) && lv < INT_MAX
			&& lv > INT_MIN) ? (int)lv : -1;
	}
	/* If not a numerical value, assign according to effect index */
	switch (index) {
		/* Projection name */
		case EF_PROJECT_LOS:
		case EF_PROJECT_LOS_AWARE:
		case EF_DESTRUCTION:
		case EF_SPOT:
		case EF_SPHERE:
		case EF_ZONE:
		case EF_BALL:
		case EF_CLOUD:
		case EF_BREATH:
		case EF_ARC:
		case EF_SHORT_BEAM:
		case EF_LASH:
		case EF_SWARM:
		case EF_STRIKE:
		case EF_STAR:
		case EF_STAR_BALL:
		case EF_CHAIN:
		case EF_BOLT:
		case EF_BEAM:
		case EF_BOLT_OR_BEAM:
		case EF_LINE:
		case EF_ALTER:
		case EF_BOLT_STATUS:
		case EF_BOLT_STATUS_DAM:
		case EF_BOLT_AWARE:
		case EF_MELEE_BLOWS:
		case EF_TOUCH:
		case EF_TOUCH_AWARE:
			return proj_name_to_idx(type);

		/* Timed effect name */
		case EF_CURE:
		case EF_TIMED_SET:
		case EF_TIMED_INC:
		case EF_TIMED_INC_NO_RES:
		case EF_TIMED_DEC:
			return timed_name_to_idx(type);

		/* Nourishment types */
		case EF_NOURISH:
			if (streq(type, "INC_BY")) {
				return 0;
			} else if (streq(type, "DEC_BY")) {
				return 1;
			} else if (streq(type, "SET_TO")) {
				return 2;
			} else if (streq(type, "INC_TO")) {
				return 3;
			}
			break;

		/* Monster timed effect name */
		case EF_MON_TIMED_INC:
			return mon_timed_name_to_idx(type);

		/* Summon name */
		case EF_SUMMON:
			return summon_name_to_idx(type);

		/* Stat name */
		case EF_RESTORE_STAT:
		case EF_DRAIN_STAT:
		case EF_LOSE_RANDOM_STAT:
		case EF_GAIN_STAT:
			return stat_name_to_idx(type);

		/* Enchant type name - not worth a separate function */
		case EF_ENCHANT:
			if (streq(type, "TOBOTH")) {
				return ENCH_TOBOTH;
			} else if (streq(type, "TOHIT")) {
				return ENCH_TOHIT;
			} else if (streq(type, "TODAM")) {
				return ENCH_TODAM;
			} else if (streq(type, "TOAC")) {
				return ENCH_TOAC;
			}
			break;

		/* Player shape name */
		case EF_SHAPECHANGE:
		case EF_DRAGON: {
			return shape_name_to_idx(type);
		}

		/* Targeted earthquake */
		case EF_EARTHQUAKE:
			if (streq(type, "TARGETED")) {
				return 1;
			} else if (streq(type, "NONE")) {
				return 0;
			}
			break;

		/* Inscribe a glyph */
		case EF_GLYPH:
			if (streq(type, "WARDING")) {
				return GLYPH_WARDING;
			} else if (streq(type, "DECOY")) {
				return GLYPH_DECOY;
			}
			break;

		/* Allow teleport away */
		case EF_TELEPORT:
			if (streq(type, "AWAY")) {
				return 1;
			}
			break;

		/* Allow monster teleport toward */
		case EF_TELEPORT_TO:
			if (streq(type, "SELF")) {
				return 1;
			}
			break;

		/* Restrict mana restoration */
		case EF_RESTORE_MANA: {
			if (streq(type, "SPECIAL"))
				return 1;
			break;
		}

		/* Some effects only want a radius, so this is a dummy */
		default:
			if (streq(type, "NONE")) {
				return 0;
			}
			break;
	}

	return -1;
}